

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O1

void __thiscall gvr::Mesh::loadPLY(Mesh *this,PLYReader *ply)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t *psVar3;
  size_t *psVar4;
  bool bVar5;
  Mesh *pMVar6;
  ply_type pVar7;
  ply_type pVar8;
  ply_type pVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  FloatArrayReceiver ss;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver se;
  FloatArrayReceiver vx;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  TriangleReceiver tr;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  FloatArrayReceiver sc;
  string local_390;
  string local_370;
  FloatArrayReceiver local_350;
  Mesh *local_330;
  FloatArrayReceiver local_328;
  FloatArrayReceiver local_308;
  FloatArrayReceiver local_2e8;
  FloatArrayReceiver local_2c8;
  FloatArrayReceiver local_2a8;
  FloatArrayReceiver local_288;
  FloatArrayReceiver local_268;
  FloatArrayReceiver local_248;
  long local_228;
  PLYReceiver local_220;
  Mesh *local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  FloatArrayReceiver local_90;
  FloatArrayReceiver local_70;
  FloatArrayReceiver local_50;
  
  psVar3 = &local_288.size;
  local_288.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"vertex","");
  lVar10 = PLYReader::instancesOfElement(ply,(string *)&local_288);
  if (local_288.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_288.super_PLYReceiver._vptr_PLYReceiver);
  }
  Model::setOriginFromPLY((Model *)this,ply);
  local_288.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"vertex","");
  local_248.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_248.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"scan_size","");
  pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_288,(string *)&local_248);
  uVar11 = 1;
  if (pVar7 == ply_none) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"vertex","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"scan_error","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_b0,&local_d0);
    if (pVar8 != ply_none) goto LAB_00129547;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"vertex","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"scan_conf","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_f0,&local_110);
    uVar11 = (ulong)(pVar8 != ply_none);
    bVar12 = true;
  }
  else {
LAB_00129547:
    bVar12 = false;
  }
  local_268.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_268.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"vertex","");
  local_350.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_350.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"sx","");
  local_330 = this;
  local_228 = lVar10;
  pVar8 = PLYReader::getTypeOfProperty(ply,(string *)&local_268,(string *)&local_350);
  if (pVar8 == ply_none) {
LAB_001296b3:
    bVar5 = false;
  }
  else {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"vertex","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"sy","");
    pVar9 = PLYReader::getTypeOfProperty(ply,&local_130,&local_150);
    if (pVar9 == ply_none) goto LAB_001296b3;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"vertex","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"sz","");
    PLYReader::getTypeOfProperty(ply,&local_170,&local_190);
    bVar5 = true;
  }
  (*(local_330->super_PointCloud).super_Model._vptr_Model[9])(local_330,local_228,uVar11);
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  if (pVar8 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  if (local_350.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_350.size) {
    operator_delete(local_350.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_268.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_268.size) {
    operator_delete(local_268.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (bVar12) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  if (pVar7 == ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if (local_248.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_248.size) {
    operator_delete(local_248.super_PLYReceiver._vptr_PLYReceiver);
  }
  pMVar6 = local_330;
  psVar3 = &local_350.size;
  if (local_288.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_288.size) {
    operator_delete(local_288.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_288,(pMVar6->super_PointCloud).vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_248,(pMVar6->super_PointCloud).vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_268,(pMVar6->super_PointCloud).vertex,3,2);
  local_350.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"vertex","");
  psVar4 = &local_2a8.size;
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"x","");
  PLYReader::setReceiver(ply,(string *)&local_350,(string *)&local_2a8,&local_288.super_PLYReceiver)
  ;
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_350.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_350.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_350.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"vertex","");
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"y","");
  PLYReader::setReceiver(ply,(string *)&local_350,(string *)&local_2a8,&local_248.super_PLYReceiver)
  ;
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_350.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_350.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_350.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"vertex","");
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"z","");
  PLYReader::setReceiver(ply,(string *)&local_350,(string *)&local_2a8,&local_268.super_PLYReceiver)
  ;
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_350.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
    operator_delete(local_350.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_350,(pMVar6->super_PointCloud).scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_2a8,(pMVar6->super_PointCloud).scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_50,(pMVar6->super_PointCloud).scanprop,3,2);
  if ((pMVar6->super_PointCloud).scanprop != (float *)0x0) {
    psVar3 = &local_2c8.size;
    local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
    psVar4 = &local_2e8.size;
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"scan_size","");
    PLYReader::setReceiver
              (ply,(string *)&local_2c8,(string *)&local_2e8,&local_350.super_PLYReceiver);
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"scan_error","");
    PLYReader::setReceiver
              (ply,(string *)&local_2c8,(string *)&local_2e8,&local_2a8.super_PLYReceiver);
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"scan_conf","");
    PLYReader::setReceiver
              (ply,(string *)&local_2c8,(string *)&local_2e8,&local_50.super_PLYReceiver);
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_2c8,(pMVar6->super_PointCloud).scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_2e8,(pMVar6->super_PointCloud).scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_70,(pMVar6->super_PointCloud).scanpos,3,2);
  if ((pMVar6->super_PointCloud).scanpos != (float *)0x0) {
    psVar3 = &local_308.size;
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    psVar4 = &local_328.size;
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"sx","");
    PLYReader::setReceiver
              (ply,(string *)&local_308,(string *)&local_328,&local_2c8.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"sy","");
    PLYReader::setReceiver
              (ply,(string *)&local_308,(string *)&local_328,&local_2e8.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"sz","");
    PLYReader::setReceiver
              (ply,(string *)&local_308,(string *)&local_328,&local_70.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar3) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_308,pMVar6->normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_328,pMVar6->normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_90,pMVar6->normal,3,2);
  paVar1 = &local_390.field_2;
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  paVar2 = &local_370.field_2;
  local_370._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"nx","");
  PLYReader::setReceiver(ply,&local_390,&local_370,&local_308.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != paVar2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  local_370._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"ny","");
  PLYReader::setReceiver(ply,&local_390,&local_370,&local_328.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != paVar2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  local_370._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"nz","");
  PLYReader::setReceiver(ply,&local_390,&local_370,&local_90.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != paVar2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"face","");
  uVar11 = PLYReader::instancesOfElement(ply,&local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  pMVar6 = local_330;
  (*(local_330->super_PointCloud).super_Model._vptr_Model[10])(local_330,uVar11 & 0xffffffff);
  local_220._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00178208;
  local_218 = pMVar6;
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"face","");
  local_370._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"vertex_index","");
  PLYReader::setReceiver(ply,&local_390,&local_370,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != paVar2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"face","");
  local_370._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"vertex_indices","");
  PLYReader::setReceiver(ply,&local_390,&local_370,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != paVar2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  PLYReader::readData(ply);
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"vertex","");
  local_370._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"nx","");
  pVar7 = PLYReader::getTypeOfProperty(ply,&local_390,&local_370);
  bVar12 = true;
  if (pVar7 != ply_none) {
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"vertex","");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"ny","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_1b0,&local_1f0);
    if (pVar8 != ply_none) {
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vertex","");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"nz","");
      pVar8 = PLYReader::getTypeOfProperty(ply,&local_210,&local_1d0);
      bVar12 = pVar8 == ply_none;
      bVar5 = true;
      goto LAB_0012a1dd;
    }
  }
  bVar5 = false;
LAB_0012a1dd:
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  if (pVar7 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != paVar2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  pMVar6 = local_330;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if (bVar12) {
    recalculateNormals(pMVar6);
  }
  else {
    normalizeNormals(pMVar6);
  }
  return;
}

Assistant:

void Mesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}